

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

size_type find(string *text,string *pattern,size_type begin,bool sensitive)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong local_68;
  size_t i;
  int diff;
  char *end;
  char *t;
  char *start;
  size_t len;
  char *p;
  bool sensitive_local;
  size_type begin_local;
  string *pattern_local;
  string *text_local;
  
  if (sensitive) {
    text_local = (string *)std::__cxx11::string::find((string *)text,(ulong)pattern);
  }
  else {
    lVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::length();
    if (uVar4 == 0) {
      text_local = (string *)0x0;
    }
    else {
      uVar5 = std::__cxx11::string::length();
      if (begin < uVar5) {
        lVar6 = std::__cxx11::string::c_str();
        lVar7 = std::__cxx11::string::size();
        for (end = (char *)(lVar6 + begin); end <= (char *)((lVar6 + lVar7) - uVar4); end = end + 1)
        {
          i._4_4_ = 0;
          for (local_68 = 0; local_68 < uVar4; local_68 = local_68 + 1) {
            iVar1 = tolower((int)end[local_68]);
            iVar2 = tolower((int)*(char *)(lVar3 + local_68));
            i._4_4_ = iVar1 - iVar2;
            if (i._4_4_ != 0) break;
          }
          if (i._4_4_ == 0) {
            return (size_type)(end + -lVar6);
          }
        }
        text_local = (string *)0xffffffffffffffff;
      }
      else {
        text_local = (string *)0xffffffffffffffff;
      }
    }
  }
  return (size_type)text_local;
}

Assistant:

std::string::size_type find (
  const std::string& text,
  const std::string& pattern,
  std::string::size_type begin,
  bool sensitive)
{
  // Implement a sensitive find, which is really just a loop withing a loop,
  // comparing lower-case versions of each character in turn.
  if (!sensitive)
  {
    // Handle empty pattern.
    const char* p = pattern.c_str ();
    size_t len = pattern.length ();
    if (len == 0)
      return 0;

    // Handle bad begin.
    if (begin >= text.length ())
      return std::string::npos;

    // Evaluate these once, for performance reasons.
    const char* start = text.c_str ();
    const char* t = start + begin;
    const char* end = start + text.size ();

    for (; t <= end - len; ++t)
    {
      int diff = 0;
      for (size_t i = 0; i < len; ++i)
        if ((diff = tolower (t[i]) - tolower (p[i])))
          break;

      // diff == 0 means there was no break from the loop, which only occurs
      // when a difference is detected.  Therefore, the loop terminated, and
      // diff is zero.
      if (diff == 0)
        return t - start;
    }

    return std::string::npos;
  }

  // Otherwise, just use std::string::find.
  return text.find (pattern, begin);
}